

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

png_uint_32 png_check_keyword(png_structrp png_ptr,png_const_charp key,png_bytep new_key)

{
  byte bVar1;
  bool bVar2;
  png_bytep ppVar3;
  png_const_charp pcVar4;
  char local_148 [8];
  png_warning_parameters p;
  uint uStack_38;
  png_byte ch;
  int space;
  int bad_character;
  png_uint_32 key_len;
  png_const_charp orig_key;
  png_bytep new_key_local;
  png_const_charp key_local;
  png_structrp png_ptr_local;
  
  space = 0;
  uStack_38 = 0;
  bVar2 = true;
  orig_key = (png_const_charp)new_key;
  new_key_local = (png_bytep)key;
  if (key == (png_const_charp)0x0) {
    *new_key = '\0';
    png_ptr_local._4_4_ = 0;
  }
  else {
    while (*new_key_local != '\0' && (uint)space < 0x4f) {
      ppVar3 = new_key_local + 1;
      bVar1 = *new_key_local;
      new_key_local = ppVar3;
      if (((bVar1 < 0x21) || (0x7e < bVar1)) && (bVar1 < 0xa1)) {
        if (bVar2) {
          if (uStack_38 == 0) {
            uStack_38 = (uint)bVar1;
          }
        }
        else {
          pcVar4 = orig_key + 1;
          *orig_key = ' ';
          space = space + 1;
          bVar2 = true;
          orig_key = pcVar4;
          if (bVar1 != 0x20) {
            uStack_38 = (uint)bVar1;
          }
        }
      }
      else {
        *orig_key = bVar1;
        space = space + 1;
        bVar2 = false;
        orig_key = orig_key + 1;
      }
    }
    if ((space != 0) && (bVar2)) {
      space = space + -1;
      orig_key = orig_key + -1;
      if (uStack_38 == 0) {
        uStack_38 = 0x20;
      }
    }
    *orig_key = '\0';
    if (space == 0) {
      png_ptr_local._4_4_ = 0;
    }
    else {
      if (*new_key_local == '\0') {
        if (uStack_38 != 0) {
          png_warning_parameter((char (*) [32])local_148,1,key);
          png_warning_parameter_signed((char (*) [32])local_148,2,4,uStack_38);
          png_formatted_warning
                    (png_ptr,(char (*) [32])local_148,"keyword \"@1\": bad character \'0x@2\'");
        }
      }
      else {
        png_warning(png_ptr,"keyword truncated");
      }
      png_ptr_local._4_4_ = space;
    }
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 /* PRIVATE */
png_check_keyword(png_structrp png_ptr, png_const_charp key, png_bytep new_key)
{
#ifdef PNG_WARNINGS_SUPPORTED
   png_const_charp orig_key = key;
#endif
   png_uint_32 key_len = 0;
   int bad_character = 0;
   int space = 1;

   png_debug(1, "in png_check_keyword");

   if (key == NULL)
   {
      *new_key = 0;
      return 0;
   }

   while (*key && key_len < 79)
   {
      png_byte ch = (png_byte)*key++;

      if ((ch > 32 && ch <= 126) || (ch >= 161 /*&& ch <= 255*/))
      {
         *new_key++ = ch; ++key_len; space = 0;
      }

      else if (space == 0)
      {
         /* A space or an invalid character when one wasn't seen immediately
          * before; output just a space.
          */
         *new_key++ = 32; ++key_len; space = 1;

         /* If the character was not a space then it is invalid. */
         if (ch != 32)
            bad_character = ch;
      }

      else if (bad_character == 0)
         bad_character = ch; /* just skip it, record the first error */
   }

   if (key_len > 0 && space != 0) /* trailing space */
   {
      --key_len; --new_key;
      if (bad_character == 0)
         bad_character = 32;
   }

   /* Terminate the keyword */
   *new_key = 0;

   if (key_len == 0)
      return 0;

#ifdef PNG_WARNINGS_SUPPORTED
   /* Try to only output one warning per keyword: */
   if (*key != 0) /* keyword too long */
      png_warning(png_ptr, "keyword truncated");

   else if (bad_character != 0)
   {
      PNG_WARNING_PARAMETERS(p)

      png_warning_parameter(p, 1, orig_key);
      png_warning_parameter_signed(p, 2, PNG_NUMBER_FORMAT_02x, bad_character);

      png_formatted_warning(png_ptr, p, "keyword \"@1\": bad character '0x@2'");
   }
#else /* !WARNINGS */
   PNG_UNUSED(png_ptr)
#endif /* !WARNINGS */

   return key_len;
}